

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4menc.c
# Opt level: O1

int y4m_write_file_header
              (char *buf,size_t len,int width,int height,AvxRational *framerate,int monochrome,
              aom_chroma_sample_position_t csp,aom_img_fmt_t fmt,uint bit_depth,
              aom_color_range_t range)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  if (monochrome == 0) {
    pcVar2 = (char *)0x0;
    switch(bit_depth) {
    case 8:
      if (fmt == AOM_IMG_FMT_I444) {
        pcVar2 = "C444";
        goto switchD_00123d50_caseD_b;
      }
      if (fmt == AOM_IMG_FMT_I422) {
        pcVar2 = "C422";
        goto switchD_00123d50_caseD_b;
      }
      pcVar3 = "C420jpeg";
      if (csp == AOM_CSP_COLOCATED) {
        pcVar3 = "C420";
      }
      bVar4 = csp == AOM_CSP_VERTICAL;
      pcVar2 = "C420mpeg2 XYSCSS=420MPEG2";
      break;
    case 9:
      pcVar3 = "C420p9 XYSCSS=420P9";
      if (fmt == AOM_IMG_FMT_I42216) {
        pcVar3 = "C422p9 XYSCSS=422P9";
      }
      bVar4 = fmt == AOM_IMG_FMT_I44416;
      pcVar2 = "C444p9 XYSCSS=444P9";
      break;
    case 10:
      pcVar3 = "C420p10 XYSCSS=420P10";
      if (fmt == AOM_IMG_FMT_I42216) {
        pcVar3 = "C422p10 XYSCSS=422P10";
      }
      bVar4 = fmt == AOM_IMG_FMT_I44416;
      pcVar2 = "C444p10 XYSCSS=444P10";
      break;
    default:
      goto switchD_00123d50_caseD_b;
    case 0xc:
      pcVar3 = "C420p12 XYSCSS=420P12";
      if (fmt == AOM_IMG_FMT_I42216) {
        pcVar3 = "C422p12 XYSCSS=422P12";
      }
      bVar4 = fmt == AOM_IMG_FMT_I44416;
      pcVar2 = "C444p12 XYSCSS=444P12";
      break;
    case 0xe:
      pcVar3 = "C420p14 XYSCSS=420P14";
      if (fmt == AOM_IMG_FMT_I42216) {
        pcVar3 = "C422p14 XYSCSS=422P14";
      }
      bVar4 = fmt == AOM_IMG_FMT_I44416;
      pcVar2 = "C444p14 XYSCSS=444P14";
      break;
    case 0x10:
      pcVar3 = "C420p16 XYSCSS=420P16";
      if (fmt == AOM_IMG_FMT_I42216) {
        pcVar3 = "C422p16 XYSCSS=422P16";
      }
      bVar4 = fmt == AOM_IMG_FMT_I44416;
      pcVar2 = "C444p16 XYSCSS=444P16";
    }
    if (!bVar4) {
      pcVar2 = pcVar3;
    }
  }
  else if (bit_depth - 8 < 9) {
    pcVar2 = (&PTR_anon_var_dwarf_8a54_005d2110)[bit_depth - 8];
  }
  else {
    pcVar2 = (char *)0x0;
  }
switchD_00123d50_caseD_b:
  pcVar3 = "";
  if (range == AOM_CR_FULL_RANGE) {
    pcVar3 = " XCOLORRANGE=FULL";
  }
  iVar1 = snprintf(buf,len,"YUV4MPEG2 W%d H%d F%d:%d Ip %s%s\n",width,height,
                   (ulong)(uint)framerate->numerator,(ulong)(uint)framerate->denominator,pcVar2,
                   pcVar3);
  return iVar1;
}

Assistant:

int y4m_write_file_header(char *buf, size_t len, int width, int height,
                          const struct AvxRational *framerate, int monochrome,
                          aom_chroma_sample_position_t csp, aom_img_fmt_t fmt,
                          unsigned int bit_depth, aom_color_range_t range) {
  const char *color = monochrome ? monochrome_colorspace(bit_depth)
                                 : colorspace(bit_depth, csp, fmt);
  const char *color_range = "";  // Default assumption is studio range.
  if (range == AOM_CR_FULL_RANGE) {
    color_range = " XCOLORRANGE=FULL";
  }
  return snprintf(buf, len, "YUV4MPEG2 W%d H%d F%d:%d Ip %s%s\n", width, height,
                  framerate->numerator, framerate->denominator, color,
                  color_range);
}